

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O2

String * __thiscall
doctest::detail::stringifyBinaryExpr<std::wostream*,std::wostream*>
          (String *__return_storage_ptr__,detail *this,
          basic_ostream<wchar_t,_std::char_traits<wchar_t>_> **lhs,char *op,
          basic_ostream<wchar_t,_std::char_traits<wchar_t>_> **rhs)

{
  basic_ostream<wchar_t,_std::char_traits<wchar_t>_> **in;
  String SStack_78;
  String local_60;
  String local_48;
  String local_30;
  
  toStream<std::wostream*>(&local_48,this,lhs);
  String::String(&local_60,(char *)lhs);
  operator+(&local_30,&local_48,&local_60);
  toStream<std::wostream*>(&SStack_78,(detail *)op,in);
  operator+(__return_storage_ptr__,&local_30,&SStack_78);
  String::~String(&SStack_78);
  String::~String(&local_30);
  String::~String(&local_60);
  String::~String(&local_48);
  return __return_storage_ptr__;
}

Assistant:

String stringifyBinaryExpr(const DOCTEST_REF_WRAP(L) lhs, const char* op,
                               const DOCTEST_REF_WRAP(R) rhs) {
        return (DOCTEST_STRINGIFY(lhs)) + op + (DOCTEST_STRINGIFY(rhs));
    }